

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O0

CommandOptions * read_timed_text_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  _func_int **pp_Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  Dictionary *this;
  byte_t *pbVar6;
  uint *puVar7;
  pointer pTVar8;
  char *pcVar9;
  IFileReaderFactory *in_RDX;
  Result_t local_7f0 [111];
  allocator<char> local_781;
  UUID local_780;
  string local_760 [32];
  string local_740 [110];
  allocator<char> local_6d2;
  allocator<char> local_6d1;
  UUID local_6d0;
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [104];
  FileWriter local_5e8 [8];
  FileWriter Writer_1;
  UUID local_5b0;
  UUID local_590 [3];
  iterator local_528;
  _List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor> local_520;
  iterator local_518;
  _List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor> local_510;
  Result_t local_508 [111];
  allocator<char> local_499;
  string local_498 [32];
  string local_478 [104];
  FileWriter local_410 [8];
  FileWriter Writer;
  Result_t local_3d8 [104];
  undefined1 local_370 [208];
  _List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor> local_2a0;
  const_iterator ri;
  char buf [64];
  allocator<char> local_249;
  ui32_t write_count;
  undefined1 local_228 [8];
  string out_path;
  string XMLDoc;
  Result_t local_1e0 [111];
  allocator<char> local_171;
  string local_170 [39];
  undefined1 local_149;
  long *local_148;
  TimedTextDescriptor *tt_descriptor;
  TimedTextDescriptor TDesc;
  undefined1 local_98 [8];
  FrameBuffer FrameBuffer;
  MXFReader Reader;
  HMACContext *HMAC;
  AESDecContext *Context;
  IFileReaderFactory *fileReaderFactory_local;
  CommandOptions *Options_local;
  Result_t *result;
  
  AS_02::TimedText::MXFReader::MXFReader
            ((MXFReader *)(FrameBuffer.m_MIMEType.field_2._M_local_buf + 8),in_RDX);
  ASDCP::TimedText::FrameBuffer::FrameBuffer
            ((FrameBuffer *)local_98,
             *(ui32_t *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4));
  ASDCP::TimedText::TimedTextDescriptor::TimedTextDescriptor((TimedTextDescriptor *)&tt_descriptor);
  local_148 = (long *)0x0;
  local_149 = 0;
  pp_Var1 = fileReaderFactory[0xb]._vptr_IFileReaderFactory;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_170,(char *)pp_Var1,&local_171);
  AS_02::TimedText::MXFReader::OpenRead((string *)Options);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if (-1 < iVar4) {
    plVar5 = (long *)AS_02::TimedText::MXFReader::OP1aHeader();
    this = (Dictionary *)ASDCP::DefaultCompositeDict();
    pbVar6 = ASDCP::Dictionary::ul(this,MDD_TimedTextDescriptor);
    (**(code **)(*plVar5 + 0xa8))(local_1e0,plVar5,pbVar6,&local_148);
    Kumu::Result_t::operator=((Result_t *)Options,local_1e0);
    Kumu::Result_t::~Result_t(local_1e0);
    if (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0) {
      (**(code **)(*local_148 + 0x88))(local_148,0);
    }
    iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if (-1 < iVar4) {
      std::__cxx11::string::string((string *)(out_path.field_2._M_local_buf + 8));
      pp_Var1 = fileReaderFactory[6]._vptr_IFileReaderFactory;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&write_count,(char *)pp_Var1,&local_249);
      Kumu::PathDirname((string *)local_228,(char)&write_count);
      std::__cxx11::string::~string((string *)&write_count);
      std::allocator<char>::~allocator(&local_249);
      std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::_List_const_iterator
                (&local_2a0);
      AS_02::TimedText::MXFReader::ReadTimedTextResource
                ((string *)(local_370 + 0x68),
                 (AESDecContext *)(FrameBuffer.m_MIMEType.field_2._M_local_buf + 8),
                 (HMACContext *)(out_path.field_2._M_local_buf + 8));
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)(local_370 + 0x68));
      Kumu::Result_t::~Result_t((Result_t *)(local_370 + 0x68));
      iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar4) {
        AS_02::TimedText::MXFReader::FillTimedTextDescriptor((TimedTextDescriptor *)local_370);
        Kumu::Result_t::~Result_t((Result_t *)local_370);
        ASDCP::FrameBuffer::Capacity((uint)local_3d8);
        Kumu::Result_t::~Result_t(local_3d8);
        if (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0) {
          ASDCP::TimedText::DescriptorDump((TimedTextDescriptor *)&tt_descriptor,(_IO_FILE *)0x0);
        }
      }
      iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if ((-1 < iVar4) &&
         (((ulong)fileReaderFactory[1]._vptr_IFileReaderFactory & 0x100000000) == 0)) {
        Kumu::FileWriter::FileWriter(local_410);
        pp_Var1 = fileReaderFactory[6]._vptr_IFileReaderFactory;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_498,(char *)pp_Var1,&local_499);
        Kumu::FileWriter::OpenWrite(local_478);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_478);
        Kumu::Result_t::~Result_t((Result_t *)local_478);
        std::__cxx11::string::~string(local_498);
        std::allocator<char>::~allocator(&local_499);
        iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        if (-1 < iVar4) {
          puVar7 = (uint *)std::__cxx11::string::c_str();
          std::__cxx11::string::size();
          Kumu::FileWriter::Write((uchar *)local_508,(uint)local_410,puVar7);
          Kumu::Result_t::operator=((Result_t *)Options,local_508);
          Kumu::Result_t::~Result_t(local_508);
        }
        Kumu::FileWriter::~FileWriter(local_410);
      }
      local_518._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
           ::begin((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                    *)((long)&TDesc.EncodingName.field_2 + 8));
      std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::_List_const_iterator
                (&local_510,&local_518);
      local_2a0._M_node = local_510._M_node;
      while( true ) {
        local_528._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
             ::end((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                    *)((long)&TDesc.EncodingName.field_2 + 8));
        std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::
        _List_const_iterator(&local_520,&local_528);
        bVar2 = std::operator!=(&local_2a0,&local_520);
        bVar3 = false;
        if (bVar2) {
          iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
          bVar3 = -1 < iVar4;
        }
        if (!bVar3) break;
        pTVar8 = std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::
                 operator->(&local_2a0);
        Kumu::UUID::UUID(&local_5b0,(byte_t *)pTVar8);
        AS_02::TimedText::MXFReader::ReadAncillaryResource
                  (local_590,(FrameBuffer *)((long)&FrameBuffer.m_MIMEType.field_2 + 8),
                   (AESDecContext *)&local_5b0,(HMACContext *)local_98);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_590);
        Kumu::Result_t::~Result_t((Result_t *)local_590);
        Kumu::UUID::~UUID(&local_5b0);
        iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        if ((-1 < iVar4) &&
           (((ulong)fileReaderFactory[1]._vptr_IFileReaderFactory & 0x100000000) == 0)) {
          Kumu::FileWriter::FileWriter(local_5e8);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_228,"");
          if (bVar3) {
            pTVar8 = std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::
                     operator->(&local_2a0);
            Kumu::UUID::UUID(&local_6d0,(byte_t *)pTVar8);
            pcVar9 = Kumu::UUID::EncodeHex(&local_6d0,(char *)&ri,0x40);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_6b0,pcVar9,&local_6d1);
            Kumu::PathJoin(local_690,(string *)local_228,(char)local_6b0);
            pcVar9 = (char *)std::__cxx11::string::c_str();
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_670,pcVar9,&local_6d2);
            Kumu::FileWriter::OpenWrite(local_650);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_650);
            Kumu::Result_t::~Result_t((Result_t *)local_650);
            std::__cxx11::string::~string(local_670);
            std::allocator<char>::~allocator(&local_6d2);
            std::__cxx11::string::~string(local_690);
            std::__cxx11::string::~string(local_6b0);
            std::allocator<char>::~allocator(&local_6d1);
            Kumu::UUID::~UUID(&local_6d0);
          }
          else {
            pTVar8 = std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::
                     operator->(&local_2a0);
            Kumu::UUID::UUID(&local_780,(byte_t *)pTVar8);
            pcVar9 = Kumu::UUID::EncodeHex(&local_780,(char *)&ri,0x40);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_760,pcVar9,&local_781);
            Kumu::FileWriter::OpenWrite(local_740);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_740);
            Kumu::Result_t::~Result_t((Result_t *)local_740);
            std::__cxx11::string::~string(local_760);
            std::allocator<char>::~allocator(&local_781);
            Kumu::UUID::~UUID(&local_780);
          }
          iVar4 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
          if (-1 < iVar4) {
            puVar7 = (uint *)ASDCP::FrameBuffer::RoData((FrameBuffer *)local_98);
            ASDCP::FrameBuffer::Size((FrameBuffer *)local_98);
            Kumu::FileWriter::Write((uchar *)local_7f0,(uint)local_5e8,puVar7);
            Kumu::Result_t::operator=((Result_t *)Options,local_7f0);
            Kumu::Result_t::~Result_t(local_7f0);
          }
          if (((ulong)fileReaderFactory->_vptr_IFileReaderFactory & 0x10000000000) != 0) {
            ASDCP::TimedText::FrameBuffer::Dump((_IO_FILE *)local_98,(uint)_stderr);
          }
          Kumu::FileWriter::~FileWriter(local_5e8);
        }
        std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::operator++
                  (&local_2a0,0);
      }
      std::__cxx11::string::~string((string *)local_228);
      std::__cxx11::string::~string((string *)(out_path.field_2._M_local_buf + 8));
    }
  }
  local_149 = 1;
  ASDCP::TimedText::TimedTextDescriptor::~TimedTextDescriptor((TimedTextDescriptor *)&tt_descriptor)
  ;
  ASDCP::TimedText::FrameBuffer::~FrameBuffer((FrameBuffer *)local_98);
  AS_02::TimedText::MXFReader::~MXFReader
            ((MXFReader *)(FrameBuffer.m_MIMEType.field_2._M_local_buf + 8));
  return Options;
}

Assistant:

Result_t
read_timed_text_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  AS_02::TimedText::MXFReader     Reader(fileReaderFactory);
  TimedText::FrameBuffer   FrameBuffer(Options.fb_size);
  //ASDCP::TimedText::FrameBuffer   FrameBuffer(Options.fb_size);
  AS_02::TimedText::TimedTextDescriptor TDesc;
  ASDCP::MXF::TimedTextDescriptor *tt_descriptor = 0;

  Result_t result = Reader.OpenRead(Options.input_filename);

  if ( ASDCP_SUCCESS(result) )
    {
      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_TimedTextDescriptor),
						     reinterpret_cast<MXF::InterchangeObject**>(&tt_descriptor));
    if ( Options.verbose_flag ) {
    	tt_descriptor->Dump();
    }


  if ( ASDCP_FAILURE(result) )
    return result;

  std::string XMLDoc;
  std::string out_path = Kumu::PathDirname(Options.file_prefix);
  ui32_t write_count;
  char buf[64];
  TimedText::ResourceList_t::const_iterator ri;

  result = Reader.ReadTimedTextResource(XMLDoc);

  if ( ASDCP_SUCCESS(result) )
    {
      Reader.FillTimedTextDescriptor(TDesc);
      FrameBuffer.Capacity(Options.fb_size);

      if ( Options.verbose_flag )
	TimedText::DescriptorDump(TDesc);
    }

  if ( ASDCP_SUCCESS(result) && ( ! Options.no_write_flag ) )
    {
      Kumu::FileWriter Writer;
      result = Writer.OpenWrite(Options.file_prefix);

      if ( ASDCP_SUCCESS(result) )
	result = Writer.Write(reinterpret_cast<const byte_t*>(XMLDoc.c_str()), XMLDoc.size(), &write_count);
    }

  for ( ri = TDesc.ResourceList.begin() ; ri != TDesc.ResourceList.end() && ASDCP_SUCCESS(result); ri++ )
    {
      result = Reader.ReadAncillaryResource(ri->ResourceID, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) && ( ! Options.no_write_flag ) )
	{
	  Kumu::FileWriter Writer;
	  if (out_path != "") {
		  result = Writer.OpenWrite(Kumu::PathJoin(out_path, Kumu::UUID(ri->ResourceID).EncodeHex(buf, 64)).c_str());
	  } else {
		  // Workaround for a bug in Kumu::PathJoin
		  result = Writer.OpenWrite(Kumu::UUID(ri->ResourceID).EncodeHex(buf, 64));
	  }

	  if ( ASDCP_SUCCESS(result) )
	    result = Writer.Write(FrameBuffer.RoData(), FrameBuffer.Size(), &write_count);

	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);
	}
    }
    }
  return result;
}